

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O1

CppType __thiscall google::protobuf::MapKey::type(MapKey *this)

{
  LogMessage *pLVar1;
  LogFinisher local_49;
  LogMessage local_48;
  
  if (this->type_ == 0) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x184);
    pLVar1 = internal::LogMessage::operator<<(&local_48,"Protocol Buffer map usage error:\n");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"MapKey::type MapKey is not initialized. ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"Call set methods to initialize MapKey.");
    internal::LogFinisher::operator=(&local_49,pLVar1);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return this->type_;
}

Assistant:

FieldDescriptor::CppType type() const {
    if (type_ == 0) {
      GOOGLE_LOG(FATAL) << "Protocol Buffer map usage error:\n"
                 << "MapKey::type MapKey is not initialized. "
                 << "Call set methods to initialize MapKey.";
    }
    return (FieldDescriptor::CppType)type_;
  }